

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_statistics.cpp
# Opt level: O3

string * __thiscall
embree::BVHNStatistics<4>::str_abi_cxx11_(string *__return_storage_ptr__,BVHNStatistics<4> *this)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  ostream *poVar7;
  LeafStat *this_00;
  size_t sVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  ostringstream stream;
  string local_1f0;
  double local_1d0;
  string *local_1c8;
  Statistics *local_1c0;
  double local_1b8;
  double dStack_1b0;
  long local_1a8;
  undefined8 local_1a0 [2];
  uint auStack_190 [22];
  ios_base local_138 [264];
  
  local_1c8 = __return_storage_ptr__;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  *(uint *)((long)auStack_190 + *(long *)(local_1a8 + -0x18)) =
       *(uint *)((long)auStack_190 + *(long *)(local_1a8 + -0x18)) & 0xfffffefb | 4;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"  primitives = ",0xf);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,", vertices = ",0xd);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,", depth = ",10);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  local_1c0 = &this->stat;
  sVar1 = (this->stat).statAABBNodes.numNodes;
  sVar8 = (this->stat).statAABBNodesMB.numNodes;
  sVar2 = (this->stat).statAABBNodesMB4D.numNodes;
  sVar3 = (this->stat).statOBBNodesMB.numNodes;
  sVar4 = (this->stat).statQuantizedNodes.numNodes;
  sVar5 = (this->stat).statOBBNodes.numNodes;
  sVar6 = (this->stat).statLeaf.numBytes;
  local_1d0 = Statistics::sah(local_1c0,this->bvh);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"  total            : sah = ",0x1b);
  *(undefined8 *)((long)local_1a0 + *(long *)(local_1a8 + -0x18) + 8) = 7;
  *(undefined8 *)((long)local_1a0 + *(long *)(local_1a8 + -0x18)) = 3;
  poVar7 = std::ostream::_M_insert<double>(local_1d0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," (100.00%), ",0xc);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"#bytes = ",9);
  sVar8 = sVar1 * 0x80 + sVar6 + (sVar8 + sVar5) * 0xe0 + sVar2 * 0x100 + sVar3 * 0x140 +
          sVar4 * 0x50;
  *(undefined8 *)((long)local_1a0 + *(long *)(local_1a8 + -0x18) + 8) = 7;
  *(undefined8 *)((long)local_1a0 + *(long *)(local_1a8 + -0x18)) = 2;
  auVar10._8_4_ = (int)(sVar8 >> 0x20);
  auVar10._0_8_ = sVar8;
  auVar10._12_4_ = 0x45300000;
  dStack_1b0 = auVar10._8_8_ - 1.9342813113834067e+25;
  local_1b8 = dStack_1b0 + ((double)CONCAT44(0x43300000,(int)sVar8) - 4503599627370496.0);
  poVar7 = std::ostream::_M_insert<double>(local_1b8 / 1000000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," MB (100.00%), ",0xf);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"#nodes = ",9);
  *(undefined8 *)((long)local_1a0 + *(long *)(local_1a8 + -0x18) + 8) = 7;
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," (",2);
  *(undefined8 *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x10) = 6;
  *(undefined8 *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 8) = 2;
  dVar9 = Statistics::fillRate(local_1c0,this->bvh);
  poVar7 = std::ostream::_M_insert<double>(dVar9 * 100.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"% filled), ",0xb);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"#bytes/prim = ",0xe);
  *(undefined8 *)((long)local_1a0 + *(long *)(local_1a8 + -0x18) + 8) = 6;
  *(undefined8 *)((long)local_1a0 + *(long *)(local_1a8 + -0x18)) = 2;
  sVar1 = this->bvh->numPrimitives;
  auVar11._0_8_ = (double)CONCAT44(0x43300000,(int)sVar1);
  auVar11._8_4_ = (int)(sVar1 >> 0x20);
  auVar11._12_4_ = 0x45300000;
  poVar7 = std::ostream::_M_insert<double>
                     (local_1b8 /
                      ((auVar11._8_8_ - 1.9342813113834067e+25) +
                      (auVar11._0_8_ - 4503599627370496.0)));
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  if ((this->stat).statAABBNodes.numNodes != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"  getAABBNodes     : ",0x15);
    Statistics::NodeStat<embree::AABBNode_t<embree::NodeRefPtr<4>,4>>::toString_abi_cxx11_
              (&local_1f0,&(this->stat).statAABBNodes,this->bvh,local_1d0,sVar8);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_1a8,local_1f0._M_dataplus._M_p,local_1f0._M_string_length)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p);
    }
  }
  if ((this->stat).statOBBNodes.numNodes != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"  ungetAABBNodes   : ",0x15);
    Statistics::NodeStat<embree::OBBNode_t<embree::NodeRefPtr<4>,4>>::toString_abi_cxx11_
              (&local_1f0,&(this->stat).statOBBNodes,this->bvh,local_1d0,sVar8);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_1a8,local_1f0._M_dataplus._M_p,local_1f0._M_string_length)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p);
    }
  }
  if ((this->stat).statAABBNodesMB.numNodes != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"  getAABBNodesMB   : ",0x15);
    Statistics::NodeStat<embree::AABBNodeMB_t<embree::NodeRefPtr<4>,4>>::toString_abi_cxx11_
              (&local_1f0,&(this->stat).statAABBNodesMB,this->bvh,local_1d0,sVar8);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_1a8,local_1f0._M_dataplus._M_p,local_1f0._M_string_length)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p);
    }
  }
  if ((this->stat).statAABBNodesMB4D.numNodes != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"  getAABBNodesMB4D : ",0x15);
    Statistics::NodeStat<embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,4>>::toString_abi_cxx11_
              (&local_1f0,&(this->stat).statAABBNodesMB4D,this->bvh,local_1d0,sVar8);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_1a8,local_1f0._M_dataplus._M_p,local_1f0._M_string_length)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p);
    }
  }
  if ((this->stat).statOBBNodesMB.numNodes != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"  ungetAABBNodesMB : ",0x15);
    Statistics::NodeStat<embree::OBBNodeMB_t<embree::NodeRefPtr<4>,4>>::toString_abi_cxx11_
              (&local_1f0,&(this->stat).statOBBNodesMB,this->bvh,local_1d0,sVar8);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_1a8,local_1f0._M_dataplus._M_p,local_1f0._M_string_length)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p);
    }
  }
  if ((this->stat).statQuantizedNodes.numNodes != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"  quantizedNodes   : ",0x15);
    Statistics::NodeStat<embree::QuantizedNode_t<embree::NodeRefPtr<4>,4>>::toString_abi_cxx11_
              (&local_1f0,&(this->stat).statQuantizedNodes,this->bvh,local_1d0,sVar8);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_1a8,local_1f0._M_dataplus._M_p,local_1f0._M_string_length)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"  leaves           : ",0x15);
  this_00 = &(this->stat).statLeaf;
  Statistics::LeafStat::toString_abi_cxx11_(&local_1f0,this_00,this->bvh,local_1d0,sVar8);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&local_1a8,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"    histogram      : ",0x15);
  Statistics::LeafStat::histToString_abi_cxx11_(&local_1f0,this_00);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&local_1a8,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  return local_1c8;
}

Assistant:

std::string BVHNStatistics<N>::str()
  {
    std::ostringstream stream;
    stream.setf(std::ios::fixed, std::ios::floatfield);
    stream << "  primitives = " << bvh->numPrimitives << ", vertices = " << bvh->numVertices << ", depth = " << stat.depth << std::endl;
    size_t totalBytes = stat.bytes(bvh);
    double totalSAH = stat.sah(bvh);
    stream << "  total            : sah = "  << std::setw(7) << std::setprecision(3) << totalSAH << " (100.00%), ";
    stream << "#bytes = " << std::setw(7) << std::setprecision(2) << totalBytes/1E6 << " MB (100.00%), ";
    stream << "#nodes = " << std::setw(7) << stat.size() << " (" << std::setw(6) << std::setprecision(2) << 100.0*stat.fillRate(bvh) << "% filled), ";
    stream << "#bytes/prim = " << std::setw(6) << std::setprecision(2) << double(totalBytes)/double(bvh->numPrimitives) << std::endl;
    if (stat.statAABBNodes.numNodes    ) stream << "  getAABBNodes     : "  << stat.statAABBNodes.toString(bvh,totalSAH,totalBytes) << std::endl;
    if (stat.statOBBNodes.numNodes  ) stream << "  ungetAABBNodes   : "  << stat.statOBBNodes.toString(bvh,totalSAH,totalBytes) << std::endl;
    if (stat.statAABBNodesMB.numNodes  ) stream << "  getAABBNodesMB   : "  << stat.statAABBNodesMB.toString(bvh,totalSAH,totalBytes) << std::endl;
    if (stat.statAABBNodesMB4D.numNodes) stream << "  getAABBNodesMB4D : "  << stat.statAABBNodesMB4D.toString(bvh,totalSAH,totalBytes) << std::endl;
    if (stat.statOBBNodesMB.numNodes) stream << "  ungetAABBNodesMB : "  << stat.statOBBNodesMB.toString(bvh,totalSAH,totalBytes) << std::endl;
    if (stat.statQuantizedNodes.numNodes  ) stream << "  quantizedNodes   : "  << stat.statQuantizedNodes.toString(bvh,totalSAH,totalBytes) << std::endl;
    if (true)                               stream << "  leaves           : "  << stat.statLeaf.toString(bvh,totalSAH,totalBytes) << std::endl;
    if (true)                               stream << "    histogram      : "  << stat.statLeaf.histToString() << std::endl;
    return stream.str();
  }